

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementHexaANCF_3813_9.cpp
# Opt level: O2

void __thiscall
chrono::fea::ChElementHexaANCF_3813_9::ComputeMassMatrix(ChElementHexaANCF_3813_9 *this)

{
  ChMatrixNM<double,_33,_33> *this_00;
  double local_30;
  Brick9_Mass myformula;
  
  this_00 = &this->m_MassMatrix;
  myformula.super_ChIntegrable3D<Eigen::Matrix<double,_33,_33,_1,_33,_33>_>._vptr_ChIntegrable3D =
       (_func_int **)&PTR__ChIntegrable3D_01181cc0;
  myformula.m_element = this;
  Eigen::DenseBase<Eigen::Matrix<double,_33,_33,_1,_33,_33>_>::setZero
            ((DenseBase<Eigen::Matrix<double,_33,_33,_1,_33,_33>_> *)this_00);
  ChQuadrature::Integrate3D<Eigen::Matrix<double,33,33,1,33,33>>
            (this_00,&myformula.super_ChIntegrable3D<Eigen::Matrix<double,_33,_33,_1,_33,_33>_>,-1.0
             ,1.0,-1.0,1.0,-1.0,1.0,3);
  local_30 = (((this->m_material).
               super___shared_ptr<chrono::fea::ChContinuumElastic,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr)->super_ChContinuumMaterial).density;
  Eigen::DenseBase<Eigen::Matrix<double,_33,_33,_1,_33,_33>_>::operator*=
            ((DenseBase<Eigen::Matrix<double,_33,_33,_1,_33,_33>_> *)this_00,&local_30);
  return;
}

Assistant:

void ChElementHexaANCF_3813_9::ComputeMassMatrix() {
    Brick9_Mass myformula(this);
    m_MassMatrix.setZero();
    ChQuadrature::Integrate3D<ChMatrixNM<double, 33, 33>>(m_MassMatrix,  // result of integration will go there
                                                          myformula,     // formula to integrate
                                                          -1, 1,         // limits in x direction
                                                          -1, 1,         // limits in y direction
                                                          -1, 1,         // limits in z direction
                                                          3              // order of integration
    );

    m_MassMatrix *= m_material->Get_density();
}